

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_object.cpp
# Opt level: O2

int __thiscall booster::shared_object::open(shared_object *this,char *__file,int __oflag,...)

{
  void *pvVar1;
  data *pdVar2;
  uint in_ECX;
  
  close(this,(int)__file);
  pvVar1 = (void *)dlopen(*(undefined8 *)__file,(in_ECX & 4) << 6 | in_ECX & 3);
  pdVar2 = (this->d).ptr_;
  pdVar2->handle = pvVar1;
  if (pvVar1 == (void *)0x0) {
    dlerror();
    pdVar2 = (data *)std::__cxx11::string::assign(___oflag);
  }
  return (int)CONCAT71((int7)((ulong)pdVar2 >> 8),pvVar1 != (void *)0x0);
}

Assistant:

bool shared_object::open(std::string const &file_name,std::string &error_message,int flags)
	{
		close();
		int dlflags = 0;
		if(flags & load_lazy)
			dlflags |= RTLD_LAZY;
		if(flags & load_now)
			dlflags |= RTLD_NOW;
		if(flags & load_global)
			dlflags |= RTLD_GLOBAL;
		if(flags & load_local)
			dlflags |= RTLD_LOCAL;
		d->handle = dlopen(file_name.c_str(),dlflags);
		if(!d->handle) {
			error_message = dlerror();
			return false;
		}
		return true;
	}